

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_useRowMatchFinderMode_e
ZSTD_resolveRowMatchFinderMode
          (ZSTD_useRowMatchFinderMode_e mode,ZSTD_compressionParameters *cParams)

{
  int iVar1;
  int kHasSIMD128;
  ZSTD_compressionParameters *cParams_local;
  ZSTD_useRowMatchFinderMode_e mode_local;
  
  cParams_local._4_4_ = mode;
  if (mode == ZSTD_urm_auto) {
    cParams_local._0_4_ = ZSTD_urm_disableRowMatchFinder;
    iVar1 = ZSTD_rowMatchFinderSupported(cParams->strategy);
    if (iVar1 == 0) {
      cParams_local._4_4_ = ZSTD_urm_disableRowMatchFinder;
    }
    else {
      if (0xe < cParams->windowLog) {
        cParams_local._0_4_ = ZSTD_urm_enableRowMatchFinder;
      }
      cParams_local._4_4_ = (ZSTD_useRowMatchFinderMode_e)cParams_local;
    }
  }
  return cParams_local._4_4_;
}

Assistant:

static ZSTD_useRowMatchFinderMode_e ZSTD_resolveRowMatchFinderMode(ZSTD_useRowMatchFinderMode_e mode,
                                                                   const ZSTD_compressionParameters* const cParams) {
#if !defined(ZSTD_NO_INTRINSICS) && (defined(__SSE2__) || defined(__ARM_NEON))
    int const kHasSIMD128 = 1;
#else
    int const kHasSIMD128 = 0;
#endif
    if (mode != ZSTD_urm_auto) return mode; /* if requested enabled, but no SIMD, we still will use row matchfinder */
    mode = ZSTD_urm_disableRowMatchFinder;
    if (!ZSTD_rowMatchFinderSupported(cParams->strategy)) return mode;
    if (kHasSIMD128) {
        if (cParams->windowLog > 14) mode = ZSTD_urm_enableRowMatchFinder;
    } else {
        if (cParams->windowLog > 17) mode = ZSTD_urm_enableRowMatchFinder;
    }
    return mode;
}